

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLleft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *eps,
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *vec,int *nonz,int rn)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  bool bVar2;
  type_conflict5 tVar3;
  int iVar4;
  int *in_RCX;
  long in_RDX;
  cpp_dec_float<50U,_int,_void> *in_RSI;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RDI;
  int in_R8D;
  int m;
  int *last;
  int *rperm;
  int *rorig;
  int *rbeg;
  int *idx;
  int *ridx;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *val;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *rval;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  y;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  int r;
  int n;
  int k;
  int j;
  int i;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  self_type *in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb4;
  undefined1 local_448 [56];
  undefined1 local_410 [8];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffbf8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffc00;
  undefined1 local_3d8 [56];
  undefined1 local_3a0 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_368;
  undefined1 local_330 [56];
  undefined4 local_2f8;
  int local_2f4;
  undefined1 local_2f0 [56];
  undefined1 local_2b8 [56];
  int *local_280;
  long local_278;
  long local_270;
  long local_268;
  int *local_260;
  long local_258;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_250;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_248;
  undefined1 local_240 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_208;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  int *local_1b8;
  long local_1b0;
  undefined8 local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  long local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_160;
  undefined1 *local_158;
  undefined1 *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  undefined1 *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  long local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  long local_e8;
  long local_e0;
  undefined1 *local_d8;
  long local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_a9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  undefined1 *local_78;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_69;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_48;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  undefined1 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8;
  
  local_180 = &local_208;
  local_1bc = in_R8D;
  local_1b8 = in_RCX;
  local_1b0 = in_RDX;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(in_RSI);
  local_178 = local_240;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(in_RSI);
  local_258._0_4_ = in_RDI[7].m_backend.exp;
  local_258._4_1_ = in_RDI[7].m_backend.neg;
  local_258._5_3_ = *(undefined3 *)&in_RDI[7].m_backend.field_0x2d;
  local_248 = std::
              vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ::data((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)0x36adbf);
  local_268._0_4_ = in_RDI[7].m_backend.fpclass;
  local_268._4_4_ = in_RDI[7].m_backend.prec_elem;
  local_270 = *(long *)in_RDI[8].m_backend.data._M_elems;
  local_278 = *(long *)(in_RDI[8].m_backend.data._M_elems + 2);
  local_1cc = 0;
  local_1c0 = 0;
  while (local_1c0 < local_1bc) {
    enQueueMax(local_1b8,&local_1c0,*(int *)(local_278 + (long)local_1b8[local_1c0] * 4));
  }
  local_280 = local_1b8 + (int)(in_RDI->m_backend).data._M_elems[1];
  while (0 < local_1bc) {
    local_1c0 = deQueueMax(local_1b8,&local_1bc);
    local_1d0 = *(int *)(local_270 + (long)local_1c0 * 4);
    local_d0 = local_1b0 + (long)local_1d0 * 0x38;
    local_c8 = &local_208;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (in_RSI,in_stack_fffffffffffffb88);
    local_158 = local_2b8;
    local_160 = &local_208;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_RSI,in_stack_fffffffffffffb88);
    local_148 = local_2f0;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_RSI,in_stack_fffffffffffffb88);
    bVar2 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
    if (bVar2) {
      local_280[-1] = local_1d0;
      local_1cc = local_1cc + 1;
      local_1c8 = *(int *)(local_268 + (long)local_1d0 * 4);
      local_1c4 = *(int *)(local_268 + (long)(local_1d0 + 1) * 4) - local_1c8;
      local_250 = local_248 + local_1c8;
      local_260 = (int *)(local_258 + (long)local_1c8 * 4);
      local_280 = local_280 + -1;
      while (iVar4 = local_1c4 + -1, bVar2 = 0 < local_1c4, local_1c4 = iVar4, bVar2) {
        local_2f4 = *local_260;
        local_e0 = local_1b0 + (long)local_2f4 * 0x38;
        local_d8 = local_240;
        local_260 = local_260 + 1;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_RSI,in_stack_fffffffffffffb88);
        local_2f8 = 0;
        tVar3 = boost::multiprecision::operator==(in_RDI,(int *)in_RSI);
        pnVar1 = local_250;
        if (tVar3) {
          local_20 = &local_368;
          local_28 = &local_208;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_29,local_28);
          local_10 = &local_368;
          local_18 = local_28;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    (in_RSI,in_stack_fffffffffffffb88);
          local_8 = &local_368;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate(in_RSI);
          pnVar1 = local_250;
          local_58 = local_330;
          local_60 = &local_368;
          local_68 = local_250;
          local_250 = local_250 + 1;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_69,local_60,pnVar1);
          local_50 = local_330;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(in_RSI);
          local_38 = local_330;
          local_40 = local_60;
          local_48 = local_68;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (in_RSI,in_stack_fffffffffffffb88,(cpp_dec_float<50U,_int,_void> *)0x36b23b);
          local_f8 = local_240;
          local_100 = local_330;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (in_RSI,in_stack_fffffffffffffb88);
          local_138 = local_3a0;
          local_140 = local_240;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    (in_RSI,in_stack_fffffffffffffb88);
          local_128 = local_3d8;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    (in_RSI,in_stack_fffffffffffffb88);
          bVar2 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
          if (bVar2) {
            local_e8 = local_1b0 + (long)local_2f4 * 0x38;
            local_f0 = local_240;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      (in_RSI,in_stack_fffffffffffffb88);
            enQueueMax(local_1b8,&local_1bc,*(int *)(local_278 + (long)local_2f4 * 4));
          }
        }
        else {
          local_98 = local_410;
          local_a0 = &local_208;
          local_a8 = local_250;
          local_250 = local_250 + 1;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_a9,local_a0,pnVar1);
          local_90 = local_410;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(in_RSI);
          local_78 = local_410;
          local_80 = local_a0;
          local_88 = local_a8;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (in_RSI,in_stack_fffffffffffffb88,(cpp_dec_float<50U,_int,_void> *)0x36b420);
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::operator-=((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                       in_stack_fffffffffffffba8);
          in_stack_fffffffffffffbb4 = 0;
          tVar3 = boost::multiprecision::operator!=(in_RDI,(int *)in_RSI);
          if (tVar3) {
            local_118 = local_448;
            local_120 = local_240;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      (in_RSI,in_stack_fffffffffffffb88);
          }
          else {
            in_stack_fffffffffffffba8 = (self_type *)0x2b2bff2ee48e0530;
            local_188 = local_448;
            local_190 = &stack0xfffffffffffffba8;
            local_198 = 0;
            local_b8 = local_190;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),(double)in_RDI,
                       in_RSI);
          }
          local_108 = local_1b0 + (long)local_2f4 * 0x38;
          local_110 = local_448;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (in_RSI,in_stack_fffffffffffffb88);
        }
      }
    }
    else {
      in_stack_fffffffffffffba4 = 0;
      local_168 = local_1b0 + (long)local_1d0 * 0x38;
      local_170 = &stack0xfffffffffffffba4;
      local_c0 = local_170;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_RSI,(long_long_type)in_stack_fffffffffffffb88);
    }
  }
  for (local_1c0 = 0; local_1c0 < local_1cc; local_1c0 = local_1c0 + 1) {
    *local_1b8 = *local_280;
    local_280 = local_280 + 1;
    local_1b8 = local_1b8 + 1;
  }
  return local_1cc;
}

Assistant:

int CLUFactor<R>::solveLleft(R eps, R* vec, int* nonz, int rn)
{
   int i, j, k, n;
   int r;
   R x, y;
   R* rval, *val;
   int* ridx, *idx;
   int* rbeg;
   int* rorig, *rperm;
   int* last;

   ridx  = l.ridx;
   rval  = l.rval.data();
   rbeg  = l.rbeg;
   rorig = l.rorig;
   rperm = l.rperm;
   n     = 0;

   i = l.firstUpdate - 1;
#ifndef SOPLEX_WITH_L_ROWS
#pragma warn "Not yet implemented, define SOPLEX_WITH_L_ROWS"
   R*   lval = l.val.data();
   int*    lidx = l.idx;
   int*    lrow = l.row;
   int*    lbeg = l.start;

   for(; i >= 0; --i)
   {
      k   = lbeg[i];
      val = &lval[k];
      idx = &lidx[k];
      x   = 0;

      for(j = lbeg[i + 1]; j > k; --j)
         x += vec[*idx++] * (*val++);

      vec[lrow[i]] -= x;
   }

#else

   /*  move rhsidx to a heap
    */
   for(i = 0; i < rn;)
      enQueueMax(nonz, &i, rperm[nonz[i]]);

   last = nonz + thedim;

   while(rn > 0)
   {
      i = deQueueMax(nonz, &rn);
      r = rorig[i];
      x = vec[r];

      if(isNotZero(x, eps))
      {
         *(--last) = r;
         n++;
         k = rbeg[r];
         j = rbeg[r + 1] - k;
         val = &rval[k];
         idx = &ridx[k];

         while(j-- > 0)
         {
            assert(l.rperm[*idx] < i);
            int m = *idx++;
            y = vec[m];

            if(y == 0)
            {
               y = -x * *val++;

               if(isNotZero(y, eps))
               {
                  vec[m] = y;
                  enQueueMax(nonz, &rn, rperm[m]);
               }
            }
            else
            {
               y -= x * *val++;
               vec[m] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
      else
         vec[r] = 0;
   }

   for(i = 0; i < n; ++i)
      *nonz++ = *last++;

#endif

   return n;
}